

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_1::logAttribList(EglTestContext *eglTestCtx,EGLint *attribList)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ostream *poVar4;
  ostringstream *poVar5;
  char *pcVar6;
  ostringstream attribListString;
  long *local_348;
  long local_340;
  long local_338 [2];
  undefined1 local_328 [376];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  do {
    iVar1 = *attribList;
    do {
      while (0x30be < iVar1) {
        if (iVar1 == 0x30bf) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_328,"EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, ",0x26);
          uVar2 = attribList[1];
          if (uVar2 < 2) {
            pcVar6 = "status == EGL_TRUE";
            if (uVar2 == 0) {
              pcVar6 = "status == EGL_FALSE";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,pcVar6 + 10,(ulong)(uVar2 == 0) | 8);
            poVar5 = (ostringstream *)local_328;
          }
          else {
            poVar5 = (ostringstream *)std::ostream::operator<<((ostringstream *)local_328,uVar2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,", ",2);
          goto LAB_00e5b19d;
        }
        if (iVar1 == 0x30fb) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_328,"EGL_CONTEXT_MINOR_VERSION_KHR, ",0x1f);
          poVar4 = (ostream *)std::ostream::operator<<((ostringstream *)local_328,attribList[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          goto LAB_00e5b19d;
        }
        if (iVar1 == 0x3138) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_328,"EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, ",
                     0x34);
          pcVar6 = "<Unknown>";
          if (attribList[1] == 0x31bf) {
            pcVar6 = "EGL_LOSE_CONTEXT_ON_RESET_KHR";
          }
          if (attribList[1] == 0x31be) {
            pcVar6 = "EGL_NO_RESET_NOTIFICATION_KHR";
          }
          sVar3 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,sVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,", ",2);
          goto LAB_00e5b19d;
        }
      }
      if (iVar1 == 0x3038) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"EGL_NONE",8);
        local_1b0._0_8_ = eglTestCtx->m_testCtx->m_log;
        poVar5 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"EGL attrib list: { ",0x13);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_348,local_340);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," }\n\n",4);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_348 != local_338) {
          operator_delete(local_348,local_338[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_138);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        std::ios_base::~ios_base((ios_base *)(local_328 + 0x70));
        return;
      }
    } while (iVar1 != 0x3098);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"EGL_CONTEXT_CLIENT_VERSION, ",0x1c);
    poVar4 = (ostream *)std::ostream::operator<<((ostringstream *)local_328,attribList[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
LAB_00e5b19d:
    attribList = attribList + 2;
  } while( true );
}

Assistant:

void logAttribList (const EglTestContext& eglTestCtx, const EGLint* attribList)
{
	const EGLint*		iter = &(attribList[0]);
	std::ostringstream	attribListString;

	while ((*iter) != EGL_NONE)
	{
		switch (*iter)
		{
		//	case EGL_CONTEXT_CLIENT_VERSION:
			case EGL_CONTEXT_MAJOR_VERSION_KHR:
				iter++;
				attribListString << "EGL_CONTEXT_CLIENT_VERSION, " << (*iter) << ", ";
				iter++;
				break;

			case EGL_CONTEXT_MINOR_VERSION_KHR:
				iter++;
				attribListString << "EGL_CONTEXT_MINOR_VERSION_KHR, " << (*iter) << ", ";
				iter++;
				break;

			case EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT:
				iter++;
				attribListString << "EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, "
								 << eglResetNotificationStrategyToString(*iter) << ", ";
				iter++;
				break;

			case EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT:
				iter++;
				attribListString << "EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, ";

				if (*iter == EGL_FALSE || *iter == EGL_TRUE)
					attribListString << (*iter ? "EGL_TRUE" : "EGL_FALSE") << ", ";
				else
					attribListString << (*iter) << ", ";
				iter++;
				break;

			default:
				DE_FATAL("Unsupported attribute");
		}
	}

	attribListString << "EGL_NONE";
	eglTestCtx.getTestContext().getLog() << TestLog::Message
										 << "EGL attrib list: { " << attribListString.str() << " }\n\n"
										 << TestLog::EndMessage;
}